

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.cpp
# Opt level: O3

value * helics::fileops::loadTomlStr(value *__return_storage_ptr__,string *tomlString)

{
  string fname;
  spec s;
  istringstream tstring;
  undefined1 *puVar1;
  undefined8 in_stack_fffffffffffffe38;
  long in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  ushort uStack_19a;
  istringstream local_198 [120];
  ios_base local_120 [264];
  
  std::__cxx11::istringstream::istringstream(local_198,(string *)tomlString,_S_in);
  puVar1 = &stack0xfffffffffffffe40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe30,"unknown file","");
  fname.field_2._M_allocated_capacity = (ulong)uStack_19a << 0x30;
  fname._M_dataplus._M_p = (pointer)0x1;
  fname._M_string_length = 0;
  fname.field_2._8_8_ = puVar1;
  s.version.patch = (int)in_stack_fffffffffffffe40;
  s.v1_1_0_allow_control_characters_in_comments =
       (bool)(char)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  s.v1_1_0_allow_newlines_in_inline_tables = (bool)(char)((ulong)in_stack_fffffffffffffe40 >> 0x28);
  s.v1_1_0_allow_trailing_comma_in_inline_tables =
       (bool)(char)((ulong)in_stack_fffffffffffffe40 >> 0x30);
  s.v1_1_0_allow_non_english_in_bare_keys = (bool)(char)((ulong)in_stack_fffffffffffffe40 >> 0x38);
  s.version.major = (int)in_stack_fffffffffffffe38;
  s.version.minor = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  s.v1_1_0_add_escape_sequence_e = (bool)(char)in_stack_fffffffffffffe48;
  s.v1_1_0_add_escape_sequence_x = (bool)(char)((ulong)in_stack_fffffffffffffe48 >> 8);
  s.v1_1_0_make_seconds_optional = (bool)(char)((ulong)in_stack_fffffffffffffe48 >> 0x10);
  s.ext_hex_float = (bool)(char)((ulong)in_stack_fffffffffffffe48 >> 0x18);
  s.ext_num_suffix = (bool)(char)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  s.ext_null_value = (bool)(char)((ulong)in_stack_fffffffffffffe48 >> 0x28);
  s._22_2_ = (short)((ulong)in_stack_fffffffffffffe48 >> 0x30);
  toml::parse<toml::type_config>(__return_storage_ptr__,(istream *)local_198,fname,s);
  if (puVar1 != &stack0xfffffffffffffe40) {
    operator_delete(puVar1,in_stack_fffffffffffffe40 + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_198);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

toml::value loadTomlStr(const std::string& tomlString)
{
    try {
        std::istringstream tstring(tomlString);
        toml::value doc = toml::parse(tstring);
        return doc;
    }
    catch (const toml::exception& se) {
        throw(std::invalid_argument(se.what()));
    }
}